

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityAlias.cpp
# Opt level: O3

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Identity::EntityAlias::create
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,EntityAlias *this,Parameters *parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Client *client;
  Path local_60;
  Url local_40;
  
  client = *(Client **)this;
  paVar1 = &local_60.value_.field_2;
  local_60.value_.field_2._M_allocated_capacity = 0;
  local_60.value_.field_2._8_8_ = 0;
  local_60.value_._M_string_length = 0;
  local_60.value_._M_dataplus._M_p = (pointer)paVar1;
  getUrl(&local_40,this,&local_60);
  HttpConsumer::post(__return_storage_ptr__,client,&local_40,parameters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.value_._M_dataplus._M_p != &local_40.value_.field_2) {
    operator_delete(local_40.value_._M_dataplus._M_p,
                    local_40.value_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.value_._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.value_._M_dataplus._M_p,
                    local_60.value_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::Identity::EntityAlias::create(const Parameters &parameters) {
  return HttpConsumer::post(client_, getUrl(Path{}), parameters);
}